

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

bool __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::equals
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,
          QObject<std::complex<float>_> *other)

{
  bool bVar1;
  SquareMatrix<std::complex<float>_> local_38;
  SquareMatrix<std::complex<float>_> local_28;
  QObject<std::complex<float>_> *local_18;
  QObject<std::complex<float>_> *other_local;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this_local;
  
  local_18 = other;
  other_local = &this->super_QObject<std::complex<float>_>;
  (*other->_vptr_QObject[7])(&local_28);
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&local_38);
  bVar1 = dense::SquareMatrix<std::complex<float>_>::operator==(&local_28,&local_38);
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_38);
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_28);
  return bVar1;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
        return ( other.matrix() == matrix() ) ;
      }